

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_getmetatable(lua_State *L,int objindex)

{
  int iVar1;
  GCObject *pGVar2;
  StkId pTVar3;
  TValue *pTVar4;
  Table **ppTVar5;
  
  pTVar4 = index2adr(L,objindex);
  iVar1 = pTVar4->tt;
  if (((long)iVar1 == 7) || (iVar1 == 5)) {
    ppTVar5 = &(((pTVar4->value).gc)->h).metatable;
  }
  else {
    ppTVar5 = L->l_G->mt + iVar1;
  }
  pGVar2 = (GCObject *)*ppTVar5;
  if (pGVar2 != (GCObject *)0x0) {
    pTVar3 = L->top;
    (pTVar3->value).gc = pGVar2;
    pTVar3->tt = 5;
    L->top = L->top + 1;
  }
  return (uint)(pGVar2 != (GCObject *)0x0);
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt = NULL;
  int res;
  lua_lock(L);
  obj = index2adr(L, objindex);
  switch (ttype(obj)) {
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttype(obj)];
      break;
  }
  if (mt == NULL)
    res = 0;
  else {
    sethvalue(L, L->top, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}